

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_file.c
# Opt level: O1

int nni_plat_file_type(char *name,int *typep)

{
  int iVar1;
  int *piVar2;
  undefined1 local_a0 [8];
  stat sbuf;
  
  iVar1 = stat(name,(stat *)local_a0);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    iVar1 = nni_plat_errno(*piVar2);
    return iVar1;
  }
  if (((uint)sbuf.st_nlink & 0xf000) == 0x4000) {
    *typep = 1;
  }
  else if (((uint)sbuf.st_nlink & 0xf000) == 0x8000) {
    *typep = 0;
  }
  else {
    *typep = 2;
  }
  return 0;
}

Assistant:

int
nni_plat_file_type(const char *name, int *typep)
{
	struct stat sbuf;

	if (stat(name, &sbuf) != 0) {
		return (nni_plat_errno(errno));
	}
	switch (sbuf.st_mode & S_IFMT) {
	case S_IFREG:
		*typep = NNI_PLAT_FILE_TYPE_FILE;
		break;
	case S_IFDIR:
		*typep = NNI_PLAT_FILE_TYPE_DIR;
		break;
	default:
		*typep = NNI_PLAT_FILE_TYPE_OTHER;
		break;
	}
	return (0);
}